

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# membuf.c
# Opt level: O0

void raviX_buffer_add_bytes(TextBuffer *mb,char *str,size_t len)

{
  size_t required_size;
  size_t len_local;
  char *str_local;
  TextBuffer *mb_local;
  
  raviX_buffer_resize(mb,mb->pos + len + 1);
  if (len < mb->capacity - mb->pos) {
    raviX_string_copy(mb->buf + mb->pos,str,mb->capacity - mb->pos);
    mb->pos = len + mb->pos;
    return;
  }
  __assert_fail("mb->capacity - mb->pos > len",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/membuf.c"
                ,0x4f,"void raviX_buffer_add_bytes(TextBuffer *, const char *, size_t)");
}

Assistant:

void raviX_buffer_add_bytes(TextBuffer *mb, const char *str, size_t len)
{
	size_t required_size = mb->pos + len + 1; /* extra byte for NULL terminator */
	raviX_buffer_resize(mb, required_size);
	assert(mb->capacity - mb->pos > len);
	raviX_string_copy(&mb->buf[mb->pos], str, mb->capacity - mb->pos);
	mb->pos += len;
}